

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string imagePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string exportPath;
  CTables tables;
  Mat cvImage;
  uint local_190;
  uint local_18c;
  uchar *local_188;
  CHog hog;
  Mat visualMat;
  Mat local_88 [96];
  
  imagePath._M_dataplus._M_p = (pointer)&imagePath.field_2;
  imagePath._M_string_length = 0;
  exportPath._M_dataplus._M_p = (pointer)&exportPath.field_2;
  exportPath._M_string_length = 0;
  imagePath.field_2._M_local_buf[0] = '\0';
  exportPath.field_2._M_local_buf[0] = '\0';
  if (argc == 2) {
    std::__cxx11::string::assign((char *)&imagePath);
    CTables::CTables(&tables,NUM_ORI_HALF,NUM_ORI_FULL,CELL_SIZE,true);
    hog.hist = (histCell **)0x0;
    hog.dx = (int **)0x0;
    hog.dy = (int **)0x0;
    cv::imread((string *)&cvImage,(int)&imagePath);
    if (local_188 != (uchar *)0x0) {
      CHog::initialHist(&hog,local_18c - (int)local_18c % CELL_SIZE,
                        local_190 - (int)local_190 % CELL_SIZE,(_cvImage >> 3 & 0x1ff) + 1,
                        NUM_ORI_HALF,NUM_ORI_FULL,CELL_SIZE);
      _visualMat = 0x1010000;
      local_228.field_2._M_allocated_capacity = 0;
      local_228._M_dataplus._M_p._0_4_ = 0x2010000;
      local_228._M_string_length = (size_type)&cvImage;
      cv::resize(0,0);
      printf("width:%d, height:%d\n",(ulong)local_18c,(ulong)local_190);
      CHog::calcDiff(&hog,local_188,tables.magnitudeTable);
      CHog::calcHist(&hog,tables.orientationFullTable,tables.orientationHalfTable,
                     tables.interpolationTableInt,tables.weightedBinTable);
      cv::Mat::Mat(local_88);
      CHog::visualizationFull((CHog *)&visualMat,(Mat *)&hog);
      cv::Mat::~Mat(local_88);
      std::__cxx11::string::rfind((char *)&imagePath,0x1081bf);
      std::__cxx11::string::rfind((char *)&imagePath,0x1081c1);
      std::__cxx11::string::rfind((char *)&imagePath,0x1081bf);
      std::__cxx11::string::substr((ulong)&local_248,(ulong)&imagePath);
      std::operator+(&local_268,"./",&local_248);
      std::operator+(&local_228,&local_268,"_hog.png");
      std::__cxx11::string::operator=((string *)&exportPath,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_248);
      local_228.field_2._M_allocated_capacity = 0;
      local_228._M_dataplus._M_p._0_4_ = 0x1010000;
      local_228._M_string_length = (size_type)&visualMat;
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      cv::imwrite((string *)&exportPath,(_InputArray *)&local_228,(vector *)&local_268);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_268);
      cv::Mat::~Mat(&visualMat);
      cv::Mat::~Mat(&cvImage);
      CHog::~CHog(&hog);
      CTables::~CTables(&tables);
      std::__cxx11::string::~string((string *)&exportPath);
      std::__cxx11::string::~string((string *)&imagePath);
      return 0;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"no such image: ");
    poVar1 = std::operator<<(poVar1,"imagePath");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"wrong input");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
	string imagePath;
	string exportPath;
	if(argc==2)
	{
		imagePath = argv[1];
	}
	else
	{
		cout<<"wrong input"<<endl;
		exit(0);
	}
	CTables tables(NUM_ORI_HALF, NUM_ORI_FULL, CELL_SIZE, true);  //建立Look Up Table
	CHog hog;

	cv::Mat cvImage = cv::imread(imagePath);
	if (cvImage.data == NULL)
	{
		cout << "no such image: " << "imagePath" << endl;
		exit(0);
	}
	int width = cvImage.cols/CELL_SIZE*CELL_SIZE;
	int height = cvImage.rows/CELL_SIZE*CELL_SIZE;
	hog.initialHist(width,
			height,
			cvImage.channels(),
			NUM_ORI_HALF,
			NUM_ORI_FULL,
			CELL_SIZE);  //初始化一幅图像的HOG直方图
	cv::resize(cvImage, cvImage, cv::Size(width, height));  //将图像尺寸调整到cell尺寸的整倍数
	printf("width:%d, height:%d\n", cvImage.cols, cvImage.rows);
	unsigned char* image = cvImage.ptr();  //将图像数据传给指针，不知道去除opencv的数据类型是否有助于提升速度

	hog.calcDiff(image, tables.magnitudeTable);
	hog.calcHist(tables.orientationFullTable,
			tables.orientationHalfTable,
			tables.interpolationTableInt,
			tables.weightedBinTable);  //计算HOG直方图

	cv::Mat visualMat = hog.visualizationFull();
	//cv::imshow("hog mat", visualMat);
	//cv::waitKey(0);
	exportPath = "./" + imagePath.substr(imagePath.rfind("/")+1, imagePath.rfind(".") - imagePath.rfind("/") - 1) + "_hog.png";
	cv::imwrite(exportPath, visualMat);
	return 0;
}